

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O3

DdNode * cuddZddIte(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  int *piVar1;
  DdHalfWord DVar2;
  uint uVar3;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  DdNode *h_1;
  DdNode *local_48;
  
  local_48 = dd->zero;
  if (local_48 == f) {
    return h;
  }
  uVar3 = 0x7fffffff;
  uVar10 = 0x7fffffff;
  if ((ulong)f->index != 0x7fffffff) {
    uVar10 = dd->permZ[f->index];
  }
  if ((ulong)g->index != 0x7fffffff) {
    uVar3 = dd->permZ[g->index];
  }
  uVar8 = 0x7fffffff;
  if ((ulong)h->index != 0x7fffffff) {
    uVar8 = dd->permZ[h->index];
  }
  if (uVar8 < uVar3) {
    uVar3 = uVar8;
  }
  if (uVar10 <= uVar3) {
    uVar3 = uVar10;
  }
  if (uVar3 == 0x7fffffff) {
    ppDVar4 = &dd->one;
  }
  else {
    ppDVar4 = dd->univ + uVar3;
  }
  pDVar5 = *ppDVar4;
  if (pDVar5 == f) {
    return g;
  }
  if (g == f) {
    g = pDVar5;
  }
  if (h == f) {
    h = local_48;
  }
  if (g == h) {
    return g;
  }
  if ((h == local_48) && (g == pDVar5)) {
    return f;
  }
  pDVar5 = cuddCacheLookupZdd(dd,0x4e,f,g,h);
  if (pDVar5 != (DdNode *)0x0) {
    return pDVar5;
  }
  uVar8 = 0x7fffffff;
  uVar3 = 0x7fffffff;
  if ((ulong)g->index != 0x7fffffff) {
    uVar3 = dd->permZ[g->index];
  }
  if ((ulong)h->index != 0x7fffffff) {
    uVar8 = dd->permZ[h->index];
  }
  uVar9 = uVar3;
  if (uVar8 < uVar3) {
    uVar9 = uVar8;
  }
  if (uVar10 < uVar9) {
    pDVar5 = cuddZddIte(dd,(f->type).kids.E,g,h);
    if (pDVar5 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  else {
    if (uVar9 < uVar10) {
      pDVar6 = g;
      pDVar5 = h;
      if (uVar3 <= uVar8) {
        pDVar6 = (g->type).kids.E;
        pDVar5 = g;
      }
      pDVar7 = h;
      if (uVar8 <= uVar3) {
        local_48 = (h->type).kids.T;
        pDVar7 = (h->type).kids.E;
      }
      DVar2 = pDVar5->index;
      pDVar6 = cuddZddIte(dd,f,pDVar6,pDVar7);
      if (pDVar6 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      uVar11 = (ulong)pDVar6 & 0xfffffffffffffffe;
      *(int *)(uVar11 + 4) = *(int *)(uVar11 + 4) + 1;
      pDVar5 = cuddZddGetNode(dd,DVar2,local_48,pDVar6);
      if (pDVar5 == (DdNode *)0x0) goto LAB_007ff0f1;
    }
    else {
      pDVar6 = g;
      pDVar5 = local_48;
      if (uVar3 <= uVar8) {
        pDVar5 = (g->type).kids.T;
        pDVar6 = (g->type).kids.E;
      }
      pDVar7 = h;
      if (uVar8 <= uVar3) {
        local_48 = (h->type).kids.T;
        pDVar7 = (h->type).kids.E;
      }
      DVar2 = f->index;
      pDVar6 = cuddZddIte(dd,(f->type).kids.E,pDVar6,pDVar7);
      if (pDVar6 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      uVar11 = (ulong)pDVar6 & 0xfffffffffffffffe;
      *(int *)(uVar11 + 4) = *(int *)(uVar11 + 4) + 1;
      pDVar7 = cuddZddIte(dd,(f->type).kids.T,pDVar5,local_48);
      if (pDVar7 == (DdNode *)0x0) {
LAB_007ff0f1:
        Cudd_RecursiveDerefZdd(dd,pDVar6);
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = cuddZddGetNode(dd,DVar2,pDVar7,pDVar6);
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,pDVar6);
        pDVar6 = pDVar7;
        goto LAB_007ff0f1;
      }
      piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
    }
    *(int *)(uVar11 + 4) = *(int *)(uVar11 + 4) + -1;
  }
  cuddCacheInsert(dd,0x4e,f,g,h,pDVar5);
  return pDVar5;
}

Assistant:

DdNode *
cuddZddIte(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *tautology, *empty;
    DdNode *r,*Gv,*Gvn,*Hv,*Hvn,*t,*e;
    unsigned int topf,topg,toph,v,top;
    int index;

    statLine(dd);
    /* Trivial cases. */
    /* One variable cases. */
    if (f == (empty = DD_ZERO(dd))) {   /* ITE(0,G,H) = H */
        return(h);
    }
    topf = cuddIZ(dd,f->index);
    topg = cuddIZ(dd,g->index);
    toph = cuddIZ(dd,h->index);
    v = ddMin(topg,toph);
    top  = ddMin(topf,v);

    tautology = (top == CUDD_MAXINDEX) ? DD_ONE(dd) : dd->univ[top];
    if (f == tautology) {                       /* ITE(1,G,H) = G */
        return(g);
    }

    /* From now on, f is known to not be a constant. */
    zddVarToConst(f,&g,&h,tautology,empty);

    /* Check remaining one variable cases. */
    if (g == h) {                       /* ITE(F,G,G) = G */
        return(g);
    }

    if (g == tautology) {                       /* ITE(F,1,0) = F */
        if (h == empty) return(f);
    }

    /* Check cache. */
    r = cuddCacheLookupZdd(dd,DD_ZDD_ITE_TAG,f,g,h);
    if (r != NULL) {
        return(r);
    }

    /* Recompute these because they may have changed in zddVarToConst. */
    topg = cuddIZ(dd,g->index);
    toph = cuddIZ(dd,h->index);
    v = ddMin(topg,toph);

    if (topf < v) {
        r = cuddZddIte(dd,cuddE(f),g,h);
        if (r == NULL) return(NULL);
    } else if (topf > v) {
        if (topg > v) {
            Gvn = g;
            index = h->index;
        } else {
            Gvn = cuddE(g);
            index = g->index;
        }
        if (toph > v) {
            Hv = empty; Hvn = h;
        } else {
            Hv = cuddT(h); Hvn = cuddE(h);
        }
        e = cuddZddIte(dd,f,Gvn,Hvn);
        if (e == NULL) return(NULL);
        cuddRef(e);
        r = cuddZddGetNode(dd,index,Hv,e);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd,e);
            return(NULL);
        }
        cuddDeref(e);
    } else {
        index = f->index;
        if (topg > v) {
            Gv = empty; Gvn = g;
        } else {
            Gv = cuddT(g); Gvn = cuddE(g);
        }
        if (toph > v) {
            Hv = empty; Hvn = h;
        } else {
            Hv = cuddT(h); Hvn = cuddE(h);
        }
        e = cuddZddIte(dd,cuddE(f),Gvn,Hvn);
        if (e == NULL) return(NULL);
        cuddRef(e);
        t = cuddZddIte(dd,cuddT(f),Gv,Hv);
        if (t == NULL) {
            Cudd_RecursiveDerefZdd(dd,e);
            return(NULL);
        }
        cuddRef(t);
        r = cuddZddGetNode(dd,index,t,e);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd,e);
            Cudd_RecursiveDerefZdd(dd,t);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert(dd,DD_ZDD_ITE_TAG,f,g,h,r);

    return(r);

}